

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::get_impact_beamlet(EvaluationFunction *this,int angle,int b)

{
  double dVar1;
  bool bVar2;
  reference ppVar3;
  Matrix *this_00;
  reference this_01;
  reference pvVar4;
  int in_EDX;
  long in_RDI;
  Matrix *Dep;
  int k;
  int o;
  pair<const_double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__range1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double ev;
  key_type *in_stack_ffffffffffffff38;
  Volume *in_stack_ffffffffffffff40;
  int iStack_70;
  int iStack_6c;
  _Self local_68;
  _Self local_60;
  undefined1 *local_58;
  pair<int,_int> local_50;
  undefined1 local_48 [48];
  double local_18;
  int local_10;
  
  local_18 = 0.0;
  local_10 = in_EDX;
  local_50 = std::make_pair<int&,int&>(&in_stack_ffffffffffffff38->first,(int *)0x12fc96);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::operator[]((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_ffffffffffffff40,
             (multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_ffffffffffffff38);
  local_58 = local_48;
  local_60._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::begin((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)in_stack_ffffffffffffff38);
  local_68._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::end((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar2 = std::operator!=(&local_60,&local_68);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
                        0x12fd07);
    iStack_70 = (ppVar3->second).first;
    iStack_6c = (ppVar3->second).second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)iStack_70);
    this_00 = Volume::getDepositionMatrix
                        (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    this_01 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_RDI + 0x150),(long)iStack_70);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iStack_6c);
    in_stack_ffffffffffffff40 = (Volume *)*pvVar4;
    dVar1 = maths::Matrix::operator()(this_00,iStack_6c,local_10);
    local_18 = (double)in_stack_ffffffffffffff40 * dVar1 + local_18;
    std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffff40);
  }
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
               *)0x12fe0c);
  return local_18;
}

Assistant:

double EvaluationFunction::get_impact_beamlet(int angle, int b){
			double ev=0;
			multimap<double, pair<int,int> > voxels = beamlet2voxel_list[make_pair(angle,b)];
			for(auto voxel:voxels){
				int o=voxel.second.first;
				int k=voxel.second.second;
				const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
				ev += D[o][k] * Dep(k,b);
			}
			return ev;
}